

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O0

bool tcu::anon_unknown_3::compareColors
               (RGBA *colorA,RGBA *colorB,int redBits,int greenBits,int blueBits)

{
  int iVar1;
  int iVar2;
  undefined1 local_31;
  int thresholdBlue;
  int thresholdGreen;
  int thresholdRed;
  int blueBits_local;
  int greenBits_local;
  int redBits_local;
  RGBA *colorB_local;
  RGBA *colorA_local;
  
  iVar1 = RGBA::getRed(colorA);
  iVar2 = RGBA::getRed(colorB);
  iVar1 = deAbs32(iVar1 - iVar2);
  local_31 = false;
  if (iVar1 <= 1 << (8U - (char)redBits & 0x1f)) {
    iVar1 = RGBA::getGreen(colorA);
    iVar2 = RGBA::getGreen(colorB);
    iVar1 = deAbs32(iVar1 - iVar2);
    local_31 = false;
    if (iVar1 <= 1 << (8U - (char)greenBits & 0x1f)) {
      iVar1 = RGBA::getBlue(colorA);
      iVar2 = RGBA::getBlue(colorB);
      iVar1 = deAbs32(iVar1 - iVar2);
      local_31 = iVar1 <= 1 << (8U - (char)blueBits & 0x1f);
    }
  }
  return local_31;
}

Assistant:

bool compareColors (const tcu::RGBA& colorA, const tcu::RGBA& colorB, int redBits, int greenBits, int blueBits)
{
	const int thresholdRed		= 1 << (8 - redBits);
	const int thresholdGreen	= 1 << (8 - greenBits);
	const int thresholdBlue		= 1 << (8 - blueBits);

	return	deAbs32(colorA.getRed()   - colorB.getRed())   <= thresholdRed   &&
			deAbs32(colorA.getGreen() - colorB.getGreen()) <= thresholdGreen &&
			deAbs32(colorA.getBlue()  - colorB.getBlue())  <= thresholdBlue;
}